

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  char *zIn;
  int in_EDX;
  sqlite3 *in_RSI;
  undefined8 *in_R8;
  char **in_R9;
  long in_FS_OFFSET;
  bool bVar2;
  int chars_parsed;
  char *z_1;
  int sz_1;
  char *z;
  int sz;
  int rc;
  char *zSql8;
  char *zTail8;
  sqlite3 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  sqlite3_stmt **in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  undefined4 in_stack_ffffffffffffff94;
  sqlite3 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  sqlite3 *in_stack_ffffffffffffffa8;
  int local_50;
  int local_2c;
  int local_14;
  sqlite3_vfs *local_10;
  Vdbe *local_8;
  
  local_8 = *(Vdbe **)(in_FS_OFFSET + 0x28);
  local_10 = (sqlite3_vfs *)0x0;
  *in_R8 = 0;
  iVar1 = sqlite3SafetyCheckOk(in_stack_ffffffffffffff78);
  if ((iVar1 == 0) || (in_RSI == (sqlite3 *)0x0)) {
    local_14 = sqlite3MisuseError(0);
  }
  else {
    if (in_EDX < 0) {
      in_stack_ffffffffffffffa4 = 0;
      while( true ) {
        bVar2 = true;
        if (*(char *)((long)&in_RSI->pVfs + (long)in_stack_ffffffffffffffa4) == '\0') {
          bVar2 = *(char *)((long)&in_RSI->pVfs + (long)(in_stack_ffffffffffffffa4 + 1)) != '\0';
        }
        if (!bVar2) break;
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 2;
      }
      in_stack_ffffffffffffff91 = 0;
      in_stack_ffffffffffffff98 = in_RSI;
      local_2c = in_stack_ffffffffffffffa4;
    }
    else {
      local_50 = 0;
      while( true ) {
        bVar2 = false;
        if ((local_50 < in_EDX) &&
           (in_stack_ffffffffffffff92 = true, bVar2 = (bool)in_stack_ffffffffffffff92,
           *(char *)((long)&in_RSI->pVfs + (long)local_50) == '\0')) {
          in_stack_ffffffffffffff92 = *(char *)((long)&in_RSI->pVfs + (long)(local_50 + 1)) != '\0';
          bVar2 = (bool)in_stack_ffffffffffffff92;
        }
        if (bVar2 == false) break;
        local_50 = local_50 + 2;
      }
      local_2c = local_50;
      in_stack_ffffffffffffff93 = 0;
      in_stack_ffffffffffffffa8 = in_RSI;
    }
    sqlite3_mutex_enter((sqlite3_mutex *)0x1463ef);
    zIn = sqlite3Utf16to8((sqlite3 *)
                          CONCAT44(in_stack_ffffffffffffff94,
                                   CONCAT13(in_stack_ffffffffffffff93,
                                            CONCAT12(in_stack_ffffffffffffff92,
                                                     CONCAT11(in_stack_ffffffffffffff91,
                                                              in_stack_ffffffffffffff90)))),
                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          (u8)((uint)in_stack_ffffffffffffff80 >> 0x18));
    if (zIn != (char *)0x0) {
      in_stack_ffffffffffffff78 = (sqlite3 *)&stack0xfffffffffffffff0;
      sqlite3LockAndPrepare
                (in_stack_ffffffffffffffa8,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(u32)in_stack_ffffffffffffff98,
                 (Vdbe *)CONCAT44(in_stack_ffffffffffffff94,
                                  CONCAT13(in_stack_ffffffffffffff93,
                                           CONCAT12(in_stack_ffffffffffffff92,
                                                    CONCAT11(in_stack_ffffffffffffff91,
                                                             in_stack_ffffffffffffff90)))),
                 in_stack_ffffffffffffff88,in_R9);
    }
    if ((local_10 != (sqlite3_vfs *)0x0) && (in_R9 != (char **)0x0)) {
      iVar1 = sqlite3Utf8CharLen(zIn,(int)local_10 - (int)zIn);
      iVar1 = sqlite3Utf16ByteLen(in_RSI,local_2c,iVar1);
      *in_R9 = (char *)((long)&in_RSI->pVfs + (long)iVar1);
    }
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff78);
    local_14 = sqlite3ApiExit(in_stack_ffffffffffffff78,0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1464cd);
  }
  if (*(Vdbe **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Make sure nBytes is non-negative and correct.  It should be the
  ** number of bytes until the end of the input buffer or until the first
  ** U+0000 character.  If the input nBytes is odd, convert it into
  ** an even number.  If the input nBytes is negative, then the input
  ** must be terminated by at least one U+0000 character */
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }else{
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; z[sz]!=0 || z[sz+1]!=0; sz += 2){}
    nBytes = sz;
  }

  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, nBytes, chars_parsed);
  }
  sqlite3DbFree(db, zSql8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}